

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAction::~IfcStructuralAction(IfcStructuralAction *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58;
  *(undefined8 *)&this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58 =
       0x8dbf50;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x40 =
       0x8dc040;
  *(undefined8 *)&this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xe0 =
       0x8dbf78;
  this[-1].super_IfcStructuralActivity.super_IfcProduct.Representation.ptr.obj =
       (LazyObject *)0x8dbfa0;
  this[-1].super_IfcStructuralActivity.GlobalOrLocal.field_2._M_allocated_capacity = 0x8dbfc8;
  *(undefined8 *)&this[-1].field_0x158 = 0x8dbff0;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject = 0x8dc018;
  puVar1 = *(undefined1 **)
            &(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x10;
  if (puVar1 != &(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this_00,&PTR_construction_vtable_24__008dc058);
  operator_delete(this_00);
  return;
}

Assistant:

IfcStructuralAction() : Object("IfcStructuralAction") {}